

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorting_network.h
# Opt level: O0

void av1_sort_fi32_8(float *k,int32_t *v)

{
  undefined4 *in_RSI;
  float *in_RDI;
  int mini_18;
  int maxi_18;
  float minf_18;
  float maxf_18;
  int mini_17;
  int maxi_17;
  float minf_17;
  float maxf_17;
  int mini_16;
  int maxi_16;
  float minf_16;
  float maxf_16;
  int mini_15;
  int maxi_15;
  float minf_15;
  float maxf_15;
  int mini_14;
  int maxi_14;
  float minf_14;
  float maxf_14;
  int mini_13;
  int maxi_13;
  float minf_13;
  float maxf_13;
  int mini_12;
  int maxi_12;
  float minf_12;
  float maxf_12;
  int mini_11;
  int maxi_11;
  float minf_11;
  float maxf_11;
  int mini_10;
  int maxi_10;
  float minf_10;
  float maxf_10;
  int mini_9;
  int maxi_9;
  float minf_9;
  float maxf_9;
  int mini_8;
  int maxi_8;
  float minf_8;
  float maxf_8;
  int mini_7;
  int maxi_7;
  float minf_7;
  float maxf_7;
  int mini_6;
  int maxi_6;
  float minf_6;
  float maxf_6;
  int mini_5;
  int maxi_5;
  float minf_5;
  float maxf_5;
  int mini_4;
  int maxi_4;
  float minf_4;
  float maxf_4;
  int mini_3;
  int maxi_3;
  float minf_3;
  float maxf_3;
  int mini_2;
  int maxi_2;
  float minf_2;
  float maxf_2;
  int mini_1;
  int maxi_1;
  float minf_1;
  float maxf_1;
  int mini;
  int maxi;
  float minf;
  float maxf;
  undefined4 local_270;
  undefined4 local_26c;
  float local_268;
  float local_264;
  undefined4 local_260;
  undefined4 local_25c;
  float local_258;
  float local_254;
  undefined4 local_250;
  undefined4 local_24c;
  float local_248;
  float local_244;
  undefined4 local_240;
  undefined4 local_23c;
  float local_238;
  float local_234;
  undefined4 local_230;
  undefined4 local_22c;
  float local_228;
  float local_224;
  undefined4 local_220;
  undefined4 local_21c;
  float local_218;
  float local_214;
  undefined4 local_210;
  undefined4 local_20c;
  float local_208;
  float local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  float local_1f8;
  float local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  float local_1e8;
  float local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  float local_1d8;
  float local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  float local_1c8;
  float local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  float local_1b8;
  float local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  float local_1a8;
  float local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  float local_198;
  float local_194;
  undefined4 local_190;
  undefined4 local_18c;
  float local_188;
  float local_184;
  undefined4 local_180;
  undefined4 local_17c;
  float local_178;
  float local_174;
  undefined4 local_170;
  undefined4 local_16c;
  float local_168;
  float local_164;
  undefined4 local_160;
  undefined4 local_15c;
  float local_158;
  float local_154;
  undefined4 local_150;
  undefined4 local_14c;
  float local_148;
  float local_144;
  
  if (*in_RDI < in_RDI[1]) {
    local_144 = in_RDI[1];
  }
  else {
    local_144 = *in_RDI;
  }
  if (*in_RDI < in_RDI[1]) {
    local_148 = *in_RDI;
  }
  else {
    local_148 = in_RDI[1];
  }
  if (*in_RDI < in_RDI[1]) {
    local_14c = in_RSI[1];
  }
  else {
    local_14c = *in_RSI;
  }
  if (*in_RDI < in_RDI[1]) {
    local_150 = *in_RSI;
  }
  else {
    local_150 = in_RSI[1];
  }
  *in_RDI = local_144;
  in_RDI[1] = local_148;
  *in_RSI = local_14c;
  in_RSI[1] = local_150;
  if (in_RDI[2] < in_RDI[3]) {
    local_154 = in_RDI[3];
  }
  else {
    local_154 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_158 = in_RDI[2];
  }
  else {
    local_158 = in_RDI[3];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_15c = in_RSI[3];
  }
  else {
    local_15c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_160 = in_RSI[2];
  }
  else {
    local_160 = in_RSI[3];
  }
  in_RDI[2] = local_154;
  in_RDI[3] = local_158;
  in_RSI[2] = local_15c;
  in_RSI[3] = local_160;
  if (in_RDI[4] < in_RDI[5]) {
    local_164 = in_RDI[5];
  }
  else {
    local_164 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_168 = in_RDI[4];
  }
  else {
    local_168 = in_RDI[5];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_16c = in_RSI[5];
  }
  else {
    local_16c = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_170 = in_RSI[4];
  }
  else {
    local_170 = in_RSI[5];
  }
  in_RDI[4] = local_164;
  in_RDI[5] = local_168;
  in_RSI[4] = local_16c;
  in_RSI[5] = local_170;
  if (in_RDI[6] < in_RDI[7]) {
    local_174 = in_RDI[7];
  }
  else {
    local_174 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_178 = in_RDI[6];
  }
  else {
    local_178 = in_RDI[7];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_17c = in_RSI[7];
  }
  else {
    local_17c = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_180 = in_RSI[6];
  }
  else {
    local_180 = in_RSI[7];
  }
  in_RDI[6] = local_174;
  in_RDI[7] = local_178;
  in_RSI[6] = local_17c;
  in_RSI[7] = local_180;
  if (*in_RDI < in_RDI[2]) {
    local_184 = in_RDI[2];
  }
  else {
    local_184 = *in_RDI;
  }
  if (*in_RDI < in_RDI[2]) {
    local_188 = *in_RDI;
  }
  else {
    local_188 = in_RDI[2];
  }
  if (*in_RDI < in_RDI[2]) {
    local_18c = in_RSI[2];
  }
  else {
    local_18c = *in_RSI;
  }
  if (*in_RDI < in_RDI[2]) {
    local_190 = *in_RSI;
  }
  else {
    local_190 = in_RSI[2];
  }
  *in_RDI = local_184;
  in_RDI[2] = local_188;
  *in_RSI = local_18c;
  in_RSI[2] = local_190;
  if (in_RDI[1] < in_RDI[3]) {
    local_194 = in_RDI[3];
  }
  else {
    local_194 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_198 = in_RDI[1];
  }
  else {
    local_198 = in_RDI[3];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_19c = in_RSI[3];
  }
  else {
    local_19c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_1a0 = in_RSI[1];
  }
  else {
    local_1a0 = in_RSI[3];
  }
  in_RDI[1] = local_194;
  in_RDI[3] = local_198;
  in_RSI[1] = local_19c;
  in_RSI[3] = local_1a0;
  if (in_RDI[4] < in_RDI[6]) {
    local_1a4 = in_RDI[6];
  }
  else {
    local_1a4 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_1a8 = in_RDI[4];
  }
  else {
    local_1a8 = in_RDI[6];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_1ac = in_RSI[6];
  }
  else {
    local_1ac = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_1b0 = in_RSI[4];
  }
  else {
    local_1b0 = in_RSI[6];
  }
  in_RDI[4] = local_1a4;
  in_RDI[6] = local_1a8;
  in_RSI[4] = local_1ac;
  in_RSI[6] = local_1b0;
  if (in_RDI[5] < in_RDI[7]) {
    local_1b4 = in_RDI[7];
  }
  else {
    local_1b4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_1b8 = in_RDI[5];
  }
  else {
    local_1b8 = in_RDI[7];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_1bc = in_RSI[7];
  }
  else {
    local_1bc = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_1c0 = in_RSI[5];
  }
  else {
    local_1c0 = in_RSI[7];
  }
  in_RDI[5] = local_1b4;
  in_RDI[7] = local_1b8;
  in_RSI[5] = local_1bc;
  in_RSI[7] = local_1c0;
  if (in_RDI[1] < in_RDI[2]) {
    local_1c4 = in_RDI[2];
  }
  else {
    local_1c4 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_1c8 = in_RDI[1];
  }
  else {
    local_1c8 = in_RDI[2];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_1cc = in_RSI[2];
  }
  else {
    local_1cc = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_1d0 = in_RSI[1];
  }
  else {
    local_1d0 = in_RSI[2];
  }
  in_RDI[1] = local_1c4;
  in_RDI[2] = local_1c8;
  in_RSI[1] = local_1cc;
  in_RSI[2] = local_1d0;
  if (in_RDI[5] < in_RDI[6]) {
    local_1d4 = in_RDI[6];
  }
  else {
    local_1d4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_1d8 = in_RDI[5];
  }
  else {
    local_1d8 = in_RDI[6];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_1dc = in_RSI[6];
  }
  else {
    local_1dc = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_1e0 = in_RSI[5];
  }
  else {
    local_1e0 = in_RSI[6];
  }
  in_RDI[5] = local_1d4;
  in_RDI[6] = local_1d8;
  in_RSI[5] = local_1dc;
  in_RSI[6] = local_1e0;
  if (*in_RDI < in_RDI[4]) {
    local_1e4 = in_RDI[4];
  }
  else {
    local_1e4 = *in_RDI;
  }
  if (*in_RDI < in_RDI[4]) {
    local_1e8 = *in_RDI;
  }
  else {
    local_1e8 = in_RDI[4];
  }
  if (*in_RDI < in_RDI[4]) {
    local_1ec = in_RSI[4];
  }
  else {
    local_1ec = *in_RSI;
  }
  if (*in_RDI < in_RDI[4]) {
    local_1f0 = *in_RSI;
  }
  else {
    local_1f0 = in_RSI[4];
  }
  *in_RDI = local_1e4;
  in_RDI[4] = local_1e8;
  *in_RSI = local_1ec;
  in_RSI[4] = local_1f0;
  if (in_RDI[3] < in_RDI[7]) {
    local_1f4 = in_RDI[7];
  }
  else {
    local_1f4 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_1f8 = in_RDI[3];
  }
  else {
    local_1f8 = in_RDI[7];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_1fc = in_RSI[7];
  }
  else {
    local_1fc = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_200 = in_RSI[3];
  }
  else {
    local_200 = in_RSI[7];
  }
  in_RDI[3] = local_1f4;
  in_RDI[7] = local_1f8;
  in_RSI[3] = local_1fc;
  in_RSI[7] = local_200;
  if (in_RDI[1] < in_RDI[5]) {
    local_204 = in_RDI[5];
  }
  else {
    local_204 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_208 = in_RDI[1];
  }
  else {
    local_208 = in_RDI[5];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_20c = in_RSI[5];
  }
  else {
    local_20c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_210 = in_RSI[1];
  }
  else {
    local_210 = in_RSI[5];
  }
  in_RDI[1] = local_204;
  in_RDI[5] = local_208;
  in_RSI[1] = local_20c;
  in_RSI[5] = local_210;
  if (in_RDI[2] < in_RDI[6]) {
    local_214 = in_RDI[6];
  }
  else {
    local_214 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_218 = in_RDI[2];
  }
  else {
    local_218 = in_RDI[6];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_21c = in_RSI[6];
  }
  else {
    local_21c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_220 = in_RSI[2];
  }
  else {
    local_220 = in_RSI[6];
  }
  in_RDI[2] = local_214;
  in_RDI[6] = local_218;
  in_RSI[2] = local_21c;
  in_RSI[6] = local_220;
  if (in_RDI[1] < in_RDI[4]) {
    local_224 = in_RDI[4];
  }
  else {
    local_224 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_228 = in_RDI[1];
  }
  else {
    local_228 = in_RDI[4];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_22c = in_RSI[4];
  }
  else {
    local_22c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_230 = in_RSI[1];
  }
  else {
    local_230 = in_RSI[4];
  }
  in_RDI[1] = local_224;
  in_RDI[4] = local_228;
  in_RSI[1] = local_22c;
  in_RSI[4] = local_230;
  if (in_RDI[3] < in_RDI[6]) {
    local_234 = in_RDI[6];
  }
  else {
    local_234 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_238 = in_RDI[3];
  }
  else {
    local_238 = in_RDI[6];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_23c = in_RSI[6];
  }
  else {
    local_23c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_240 = in_RSI[3];
  }
  else {
    local_240 = in_RSI[6];
  }
  in_RDI[3] = local_234;
  in_RDI[6] = local_238;
  in_RSI[3] = local_23c;
  in_RSI[6] = local_240;
  if (in_RDI[2] < in_RDI[4]) {
    local_244 = in_RDI[4];
  }
  else {
    local_244 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_248 = in_RDI[2];
  }
  else {
    local_248 = in_RDI[4];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_24c = in_RSI[4];
  }
  else {
    local_24c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_250 = in_RSI[2];
  }
  else {
    local_250 = in_RSI[4];
  }
  in_RDI[2] = local_244;
  in_RDI[4] = local_248;
  in_RSI[2] = local_24c;
  in_RSI[4] = local_250;
  if (in_RDI[3] < in_RDI[5]) {
    local_254 = in_RDI[5];
  }
  else {
    local_254 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_258 = in_RDI[3];
  }
  else {
    local_258 = in_RDI[5];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_25c = in_RSI[5];
  }
  else {
    local_25c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_260 = in_RSI[3];
  }
  else {
    local_260 = in_RSI[5];
  }
  in_RDI[3] = local_254;
  in_RDI[5] = local_258;
  in_RSI[3] = local_25c;
  in_RSI[5] = local_260;
  if (in_RDI[3] < in_RDI[4]) {
    local_264 = in_RDI[4];
  }
  else {
    local_264 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_268 = in_RDI[3];
  }
  else {
    local_268 = in_RDI[4];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_26c = in_RSI[4];
  }
  else {
    local_26c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_270 = in_RSI[3];
  }
  else {
    local_270 = in_RSI[4];
  }
  in_RDI[3] = local_264;
  in_RDI[4] = local_268;
  in_RSI[3] = local_26c;
  in_RSI[4] = local_270;
  return;
}

Assistant:

static inline void av1_sort_fi32_8(float k[], int32_t v[]) {
  SWAP(0, 1);
  SWAP(2, 3);
  SWAP(4, 5);
  SWAP(6, 7);
  SWAP(0, 2);
  SWAP(1, 3);
  SWAP(4, 6);
  SWAP(5, 7);
  SWAP(1, 2);
  SWAP(5, 6);
  SWAP(0, 4);
  SWAP(3, 7);
  SWAP(1, 5);
  SWAP(2, 6);
  SWAP(1, 4);
  SWAP(3, 6);
  SWAP(2, 4);
  SWAP(3, 5);
  SWAP(3, 4);
}